

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O3

bool __thiscall TypeInfo::testComplexTypes(TypeInfo *this)

{
  wchar16 wVar1;
  XMLCh XVar2;
  XMLCh XVar3;
  wchar16 wVar4;
  bool bVar5;
  DOMElement *pDVar6;
  long *plVar7;
  wchar16 *pwVar8;
  ostream *poVar9;
  char *pcVar10;
  size_t sVar11;
  long lVar12;
  long *plVar13;
  XMLCh *pXVar14;
  XMLCh *pXVar15;
  wchar16 *pwVar16;
  XStr local_38;
  XStr local_30;
  
  (**(code **)(*(long *)this->doc + 0x68))();
  local_38.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("complexTest",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pDVar6 = findElement(this,local_38.fUnicodeForm);
  XStr::~XStr(&local_38);
  plVar7 = (long *)(**(code **)(*(long *)pDVar6 + 0x1d8))(pDVar6);
  pwVar8 = (wchar16 *)(**(code **)(*plVar7 + 0x10))(plVar7);
  local_38.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("complexTestType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar8 == local_38.fUnicodeForm) {
LAB_00116a44:
    plVar7 = (long *)(**(code **)(*(long *)pDVar6 + 0x1d8))(pDVar6);
    pwVar8 = (wchar16 *)(**(code **)(*plVar7 + 0x18))(plVar7);
    local_30.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar8 != local_30.fUnicodeForm) {
      pwVar16 = local_30.fUnicodeForm;
      if (local_30.fUnicodeForm == (wchar16 *)0x0 || pwVar8 == (wchar16 *)0x0) {
        if (pwVar8 == (wchar16 *)0x0) {
          if (local_30.fUnicodeForm != (wchar16 *)0x0) goto LAB_00116ac5;
        }
        else {
          tmp = *pwVar8 == L'\0';
          if ((local_30.fUnicodeForm != (wchar16 *)0x0) && (*pwVar8 == L'\0')) {
LAB_00116ac5:
            tmp = *pwVar16 == L'\0';
          }
        }
      }
      else {
        do {
          wVar1 = *pwVar8;
          if (wVar1 == L'\0') goto LAB_00116ac5;
          pwVar8 = pwVar8 + 1;
          wVar4 = *pwVar16;
          pwVar16 = pwVar16 + 1;
        } while (wVar1 == wVar4);
        tmp = false;
      }
    }
    XStr::~XStr(&local_30);
  }
  else {
    pwVar16 = local_38.fUnicodeForm;
    if (local_38.fUnicodeForm == (wchar16 *)0x0 || pwVar8 == (wchar16 *)0x0) {
      if (pwVar8 == (wchar16 *)0x0) {
        if (local_38.fUnicodeForm == (wchar16 *)0x0) goto LAB_00116a44;
LAB_00116a32:
        wVar1 = *pwVar16;
      }
      else {
        wVar1 = *pwVar8;
        if ((local_38.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_00116a32;
      }
      if (wVar1 == L'\0') goto LAB_00116a44;
    }
    else {
      do {
        wVar1 = *pwVar8;
        if (wVar1 == L'\0') goto LAB_00116a32;
        pwVar8 = pwVar8 + 1;
        wVar4 = *pwVar16;
        pwVar16 = pwVar16 + 1;
      } while (wVar1 == wVar4);
    }
    tmp = false;
  }
  XStr::~XStr(&local_38);
  bVar5 = tmp;
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1de);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("complexTestType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_38.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    local_30.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_30.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    XStr::~XStr(&local_30);
    XStr::~XStr(&local_38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar7 = (long *)(**(code **)(*(long *)pDVar6 + 0x1d8))(pDVar6);
    lVar12 = (**(code **)(*plVar7 + 0x10))(plVar7);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00116c92:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar7 = (long *)(**(code **)(*(long *)pDVar6 + 0x1d8))(pDVar6);
      pwVar8 = (wchar16 *)(**(code **)(*plVar7 + 0x10))(plVar7);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00116c92;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar7 = (long *)(**(code **)(*(long *)pDVar6 + 0x1d8))(pDVar6);
    lVar12 = (**(code **)(*plVar7 + 0x18))(plVar7);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00116d39:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar7 = (long *)(**(code **)(*(long *)pDVar6 + 0x1d8))(pDVar6);
      pwVar8 = (wchar16 *)(**(code **)(*plVar7 + 0x18))(plVar7);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00116d39;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
  }
  plVar7 = (long *)(**(code **)(*(long *)pDVar6 + 0x50))(pDVar6);
  plVar7 = (long *)(**(code **)(*plVar7 + 0x50))(plVar7);
  plVar13 = (long *)(**(code **)(*plVar7 + 0x1d8))(plVar7);
  pXVar14 = (XMLCh *)(**(code **)(*plVar13 + 0x10))(plVar13);
  local_38.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("complexDerTestType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pXVar14 == local_38.fUnicodeForm) {
LAB_00116e35:
    plVar13 = (long *)(**(code **)(*plVar7 + 0x1d8))(plVar7);
    pwVar8 = (wchar16 *)(**(code **)(*plVar13 + 0x18))(plVar13);
    local_30.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar8 != local_30.fUnicodeForm) {
      pwVar16 = local_30.fUnicodeForm;
      if (local_30.fUnicodeForm == (wchar16 *)0x0 || pwVar8 == (wchar16 *)0x0) {
        if (pwVar8 == (wchar16 *)0x0) {
          if (local_30.fUnicodeForm != (wchar16 *)0x0) goto LAB_00116eb8;
        }
        else {
          tmp = *pwVar8 == L'\0';
          if ((local_30.fUnicodeForm != (wchar16 *)0x0) && (*pwVar8 == L'\0')) {
LAB_00116eb8:
            tmp = *pwVar16 == L'\0';
          }
        }
      }
      else {
        do {
          wVar1 = *pwVar8;
          if (wVar1 == L'\0') goto LAB_00116eb8;
          pwVar8 = pwVar8 + 1;
          wVar4 = *pwVar16;
          pwVar16 = pwVar16 + 1;
        } while (wVar1 == wVar4);
        tmp = false;
      }
    }
    XStr::~XStr(&local_30);
  }
  else {
    pXVar15 = local_38.fUnicodeForm;
    if (local_38.fUnicodeForm == (XMLCh *)0x0 || pXVar14 == (XMLCh *)0x0) {
      if (pXVar14 == (XMLCh *)0x0) {
        if (local_38.fUnicodeForm == (XMLCh *)0x0) goto LAB_00116e35;
LAB_00116e23:
        XVar2 = *pXVar15;
      }
      else {
        XVar2 = *pXVar14;
        if ((local_38.fUnicodeForm != (XMLCh *)0x0) && (XVar2 == L'\0')) goto LAB_00116e23;
      }
      if (XVar2 == L'\0') goto LAB_00116e35;
    }
    else {
      do {
        XVar2 = *pXVar14;
        if (XVar2 == L'\0') goto LAB_00116e23;
        pXVar14 = pXVar14 + 1;
        XVar3 = *pXVar15;
        pXVar15 = pXVar15 + 1;
      } while (XVar2 == XVar3);
    }
    tmp = false;
  }
  XStr::~XStr(&local_38);
  if (tmp != false) {
    return bVar5;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1e1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nExpected values : typename \'",0x1d);
  local_38.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("complexDerTestType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                              (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
  ;
  if (pcVar10 == (char *)0x0) {
    std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
  }
  else {
    sVar11 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
  local_30.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
  ;
  pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                              (local_30.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
  ;
  if (pcVar10 == (char *)0x0) {
    std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
  }
  else {
    sVar11 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
  }
  XStr::~XStr(&local_30);
  XStr::~XStr(&local_38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
  plVar13 = (long *)(**(code **)(*plVar7 + 0x1d8))(plVar7);
  lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
  if (lVar12 == 0) {
    pcVar10 = "(null)";
    sVar11 = 6;
LAB_00117082:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
  }
  else {
    plVar13 = (long *)(**(code **)(*plVar7 + 0x1d8))(plVar7);
    pwVar8 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 != (char *)0x0) {
      sVar11 = strlen(pcVar10);
      goto LAB_00117082;
    }
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
  plVar13 = (long *)(**(code **)(*plVar7 + 0x1d8))(plVar7);
  lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
  if (lVar12 == 0) {
    pcVar10 = "(null)";
    sVar11 = 6;
  }
  else {
    plVar7 = (long *)(**(code **)(*plVar7 + 0x1d8))(plVar7);
    pwVar8 = (wchar16 *)(**(code **)(*plVar7 + 0x18))(plVar7);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
      goto LAB_00117146;
    }
    sVar11 = strlen(pcVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
LAB_00117146:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return false;
}

Assistant:

bool TypeInfo::testComplexTypes() {

    bool passed = true;
    DOMNode *docEle = doc->getDocumentElement();
    UNUSED(docEle); // silence warning

    //element complexTest
    DOMElement *testEle = findElement(X("complexTest"));
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("complexTestType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("complexDerTestType"), X(""), __LINE__);
    return passed;
}